

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int on_stream_open(quicly_stream_open_t *self,quicly_stream_t *stream)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  int ret;
  test_streambuf_t *sbuf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  quicly_stream_t *in_stack_ffffffffffffffe8;
  
  iVar2 = quicly_streambuf_create
                    (in_stack_ffffffffffffffe8,
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar2 == 0) {
    lVar1 = *(long *)(in_RSI + 0xb0);
    *(undefined4 *)(lVar1 + 0x48) = 0xffffffff;
    *(undefined4 *)(lVar1 + 0x4c) = 0xffffffff;
    *(quicly_stream_callbacks_t **)(in_RSI + 0x10) = &stream_callbacks;
    return 0;
  }
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c"
                ,0x93,"int on_stream_open(quicly_stream_open_t *, quicly_stream_t *)");
}

Assistant:

static int on_stream_open(quicly_stream_open_t *self, quicly_stream_t *stream)
{
    test_streambuf_t *sbuf;
    int ret;

    ret = quicly_streambuf_create(stream, sizeof(*sbuf));
    assert(ret == 0);
    sbuf = stream->data;
    sbuf->error_received.stop_sending = -1;
    sbuf->error_received.reset_stream = -1;
    stream->callbacks = &stream_callbacks;

    return 0;
}